

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventPoolPutIpcHandle(ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc)

{
  code *pcVar1;
  undefined1 local_60 [64];
  code *local_20;
  ze_pfnEventPoolPutIpcHandle_t pfnPutIpcHandle;
  ze_context_handle_t p_Stack_10;
  ze_result_t result;
  ze_context_handle_t hContext_local;
  
  pcVar1 = DAT_0011c5b8;
  pfnPutIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  local_20 = DAT_0011c5b8;
  if (DAT_0011c5b8 != (code *)0x0) {
    p_Stack_10 = hContext;
    memcpy(local_60,&hIpc,0x40);
    pfnPutIpcHandle._4_4_ = (*pcVar1)(hContext);
  }
  return pfnPutIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolPutIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object associated with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc                 ///< [in] IPC event pool handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnPutIpcHandle = context.zeDdiTable.EventPool.pfnPutIpcHandle;
        if( nullptr != pfnPutIpcHandle )
        {
            result = pfnPutIpcHandle( hContext, hIpc );
        }
        else
        {
            // generic implementation
        }

        return result;
    }